

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall
Centaurus::ATNMachine<char>::filter_nodes
          (ATNMachine<char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *this_00;
  pointer pAVar1;
  const_reference cVar2;
  reference pvVar3;
  pointer pAVar4;
  pointer pAVar5;
  pointer pAVar6;
  pointer pAVar7;
  ulong __n;
  ATNTransition<char> *t;
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> nodes;
  vector<int,_std::allocator<int>_> index_map;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> filtered;
  int local_12c;
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> local_128;
  ATNMachine<char> *local_108;
  _Vector_base<int,_std::allocator<int>_> local_100;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> local_e8;
  ATNNode<char> local_c8;
  
  local_128.super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_100,
             ((long)(this->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_nodes).
                   super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x98,(allocator_type *)&local_c8);
  pAVar5 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar6 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((long)pAVar5 - (long)pAVar6) / 0x98 !=
      (ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __assert_fail("m_nodes.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                  ,0x148,
                  "void Centaurus::ATNMachine<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                 );
  }
  this_00 = &this->m_nodes;
  local_12c = 0;
  local_108 = this;
  for (__n = 0; pAVar4 = local_128.
                         super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
      __n < (ulong)(((long)pAVar5 - (long)pAVar6) / 0x98); __n = __n + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
    if (cVar2) {
      local_e8.
      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar3 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::at
                         (this_00,__n);
      pAVar1 = (pvVar3->m_transitions).
               super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pAVar7 = (pvVar3->m_transitions).
                    super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar1; pAVar7 = pAVar7 + 1
          ) {
        cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,(long)pAVar7->m_dest);
        if (cVar2) {
          std::
          vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
          push_back(&local_e8,pAVar7);
        }
      }
      pvVar3 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::at
                         (this_00,__n);
      ATNNode<char>::ATNNode(&local_c8,pvVar3,&local_e8);
      std::vector<Centaurus::ATNNode<char>,std::allocator<Centaurus::ATNNode<char>>>::
      emplace_back<Centaurus::ATNNode<char>>
                ((vector<Centaurus::ATNNode<char>,std::allocator<Centaurus::ATNNode<char>>> *)
                 &local_128,&local_c8);
      this = local_108;
      ATNNode<char>::~ATNNode(&local_c8);
      local_100._M_impl.super__Vector_impl_data._M_start[__n] = local_12c;
      local_12c = local_12c + 1;
      std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ::~vector(&local_e8);
    }
    else {
      local_100._M_impl.super__Vector_impl_data._M_start[__n] = -1;
    }
    pAVar6 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar5 = (this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  do {
    if (pAVar4 == local_128.
                  super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
      _M_move_assign(this_00,&local_128);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_100);
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::~vector
                (&local_128);
      return;
    }
    pAVar1 = (pAVar4->m_transitions).
             super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar7 = (pAVar4->m_transitions).
                  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar1; pAVar7 = pAVar7 + 1)
    {
      if (local_100._M_impl.super__Vector_impl_data._M_start[pAVar7->m_dest] < 0) {
        __assert_fail("index_map[t.dest()] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                      ,0x164,
                      "void Centaurus::ATNMachine<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                     );
      }
      pAVar7->m_dest = local_100._M_impl.super__Vector_impl_data._M_start[pAVar7->m_dest];
    }
    pAVar4 = pAVar4 + 1;
  } while( true );
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<ATNNode<TCHAR> > nodes;
        std::vector<int> index_map(m_nodes.size());

        assert(m_nodes.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_nodes.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<ATNTransition<TCHAR> > filtered;
                for (const auto& t : m_nodes.at(src_index).get_transitions())
                {
                    if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.push_back(ATNNode<TCHAR>(m_nodes.at(src_index), std::move(filtered)));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                assert(index_map[t.dest()] >= 0);

                t.dest(index_map[t.dest()]);
            }
        }
        m_nodes = std::move(nodes);
    }